

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTests::init
          (CopyImageTests *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  deUint32 format;
  uint format_00;
  Context *pCVar3;
  void *pvVar4;
  bool bVar5;
  int extraout_EAX;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  TestCaseGroup *pTVar8;
  char *pcVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  long *plVar12;
  _Rb_tree_node_base *p_Var13;
  long *plVar14;
  CopyImageTests *pCVar15;
  iterator iVar16;
  long lVar17;
  long lVar18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nonCompressedFormats;
  string viewClassName;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  compressedTextureFormatViewClasses;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  textureFormatViewClasses;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  mixedViewClasses;
  vector<unsigned_int,_std::allocator<unsigned_int>_> compressedFormats;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_148;
  long *local_128;
  long lStack_120;
  long local_118;
  void *pvStack_110;
  undefined8 local_108;
  long lStack_100;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_f8;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_c8;
  map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  local_98;
  CopyImageTests *local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  TestNode *local_48;
  TestNode *local_40;
  TestNode *local_38;
  
  node = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,pCVar3->m_testCtx,"non_compressed",
             "Test copying between textures.");
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  node[1]._vptr_TestNode = (_func_int **)pCVar3;
  node_00 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,pCVar3->m_testCtx,"compressed",
             "Test copying between compressed textures.");
  node_00->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  node_00[1]._vptr_TestNode = (_func_int **)pCVar3;
  node_01 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,pCVar3->m_testCtx,"mixed",
             "Test copying between compressed and non-compressed textures.");
  node_01->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  node_01[1]._vptr_TestNode = (_func_int **)pCVar3;
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  tcu::TestNode::addChild((TestNode *)this,node_01);
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118 = 0;
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 4;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 5;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 6;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 7;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8814;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8814;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d82;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d82;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d70;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d70;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,1);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8815;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8815;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,1);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d83;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d83;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,1);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d71;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d71;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8230;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8230;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823b;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x823b;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823c;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x823c;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x881a;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x881a;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d88;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d88;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d76;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d76;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,3);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x881b;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x881b;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,3);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d89;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d89;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,3);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d77;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d77;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x822e;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x822e;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8235;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8235;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8236;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8236;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x822f;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x822f;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8239;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8239;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823a;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x823a;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8058;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8058;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d8e;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d8e;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d7c;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d7c;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c3a;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8c3a;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x906f;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x906f;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8059;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8059;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8f97;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8f97;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c43;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8c43;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,4);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c3d;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8c3d;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,5);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8051;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8051;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,5);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d8f;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d8f;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,5);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d7d;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d7d;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,5);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8f96;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8f96;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,5);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c41;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8c41;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x822d;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x822d;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8233;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8233;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8234;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8234;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x822b;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x822b;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8237;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8237;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8238;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8238;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,6);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8f95;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8f95;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,7);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8229;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8229;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,7);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8231;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8231;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,7);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8232;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8232;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,7);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_c8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8f94;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8f94;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 8;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 9;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 10;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xb;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xc;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xd;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xe;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xf;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x10;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x11;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x12;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x13;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x14;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x15;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x16;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x17;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x18;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x19;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_118 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1a;
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar6,&local_128);
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,8);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9270;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9270;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,8);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9271;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9271;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,9);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9272;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9272;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,9);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9273;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9273;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,10);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9274;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9274;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,10);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9275;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9275;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xb);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9276;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9276;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xb);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9277;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9277;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xc);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9278;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9278;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xc);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9279;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9279;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xd);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b0;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b0;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xd);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d0;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d0;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xe);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b1;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b1;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xe);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d1;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d1;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xf);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b2;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b2;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0xf);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d2;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d2;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x10);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b3;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b3;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x10);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d3;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d3;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x11);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b4;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b4;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x11);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d4;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d4;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x12);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b5;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b5;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x12);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d5;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d5;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x13);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b6;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b6;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x13);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d6;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d6;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x14);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b7;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b7;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x14);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d7;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d7;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x15);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b8;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b8;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x15);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d8;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d8;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x16);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b9;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b9;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x16);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d9;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d9;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x17);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93ba;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93ba;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x17);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93da;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93da;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x18);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bb;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93bb;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x18);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93db;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93db;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x19);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bc;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93bc;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x19);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93dc;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93dc;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x1a);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bd;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93bd;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,0x1a);
  pmVar6 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::operator[](&local_f8,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93dd;
  iVar16._M_current =
       (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (pmVar6,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93dd;
    (pmVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_108 = 0;
  lStack_100 = 0;
  local_118 = 0;
  pvStack_110 = (void *)0x0;
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&pmVar7->first,&local_128);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&pmVar7->second,&pvStack_110);
  if (pvStack_110 != (void *)0x0) {
    operator_delete(pvStack_110,lStack_100 - (long)pvStack_110);
  }
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_108 = 0;
  lStack_100 = 0;
  local_118 = 0;
  pvStack_110 = (void *)0x0;
  local_128 = (long *)0x0;
  lStack_120 = 0;
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_148);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&pmVar7->first,&local_128);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&pmVar7->second,&pvStack_110);
  if (pvStack_110 != (void *)0x0) {
    operator_delete(pvStack_110,lStack_100 - (long)pvStack_110);
  }
  if (local_128 != (long *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8814;
  iVar16._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8814;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d70;
  iVar16._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d70;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d82;
  iVar16._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d82;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9278;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9278;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9279;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9279;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9272;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9272;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9273;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9273;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b0;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b0;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b1;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b1;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b2;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b2;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b3;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b3;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b4;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b4;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b5;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b5;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b6;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b6;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b7;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b7;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b8;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b8;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93b9;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93b9;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93ba;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93ba;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bb;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93bb;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bc;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93bc;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93bd;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93bd;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d0;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d0;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d1;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d1;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d2;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d2;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d3;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d3;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d4;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d4;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d5;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d5;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d6;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d6;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d7;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d7;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d8;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d8;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93d9;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93d9;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93da;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93da;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93db;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93db;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93dc;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93dc;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)((ulong)local_128 & 0xffffffff00000000);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x93dd;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x93dd;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x881a;
  iVar16._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x881a;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d76;
  iVar16._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d76;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8d88;
  iVar16._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8d88;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8230;
  iVar16._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x8230;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823c;
  iVar16._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x823c;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x823b;
  iVar16._M_current =
       (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->first,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x823b;
    (pmVar7->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9270;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9270;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current + 1;
  }
  local_128 = (long *)CONCAT44(local_128._4_4_,2);
  pmVar7 = std::
           map<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
           ::operator[](&local_98,(key_type *)&local_128);
  local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x9271;
  iVar16._M_current =
       (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48 = node_01;
  local_40 = node_00;
  local_38 = node;
  if (iVar16._M_current ==
      (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pmVar7->second,iVar16,(uint *)&local_148);
  }
  else {
    *iVar16._M_current = 0x9271;
    iVar16._M_current = iVar16._M_current + 1;
    (pmVar7->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar16._M_current;
  }
  p_Var10 = local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_68 = this;
  if ((_Rb_tree_header *)local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_c8._M_t._M_impl.super__Rb_tree_header) {
    do {
      pCVar15 = local_68;
      _Var1 = p_Var10[1]._M_color;
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar3 = (pCVar15->super_TestCaseGroup).m_context;
      pcVar9 = viewClassToName(_Var1);
      tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar8,pCVar3->m_testCtx,pcVar9,pcVar9);
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_021985d0;
      pTVar8->m_context = pCVar3;
      iVar16._M_current = (uint *)pTVar8;
      tcu::TestNode::addChild(local_38,(TestNode *)pTVar8);
      if (0 < (int)((ulong)((long)p_Var10[1]._M_left - (long)p_Var10[1]._M_parent) >> 2)) {
        lVar18 = 0;
        do {
          p_Var11 = p_Var10[1]._M_parent;
          if (0 < (int)((ulong)((long)p_Var10[1]._M_left - (long)p_Var11) >> 2)) {
            lVar17 = 0;
            do {
              _Var1 = (&p_Var11->_M_color)[lVar18];
              _Var2 = (&p_Var11->_M_color)[lVar17];
              if (((_Var1 == _Var2) || (bVar5 = isFloatFormat(_Var1), !bVar5)) ||
                 (bVar5 = isFloatFormat(_Var2), !bVar5)) {
                iVar16._M_current = (uint *)(ulong)_Var1;
                addCopyTests(pTVar8,_Var1,_Var2);
              }
              lVar17 = lVar17 + 1;
              p_Var11 = p_Var10[1]._M_parent;
            } while (lVar17 < (int)((ulong)((long)p_Var10[1]._M_left - (long)p_Var11) >> 2));
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < (int)((ulong)((long)p_Var10[1]._M_left - (long)p_Var10[1]._M_parent) >> 2)
                );
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != &local_c8._M_t._M_impl.super__Rb_tree_header);
  }
  p_Var10 = local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_f8._M_t._M_impl.super__Rb_tree_header) {
    do {
      pCVar15 = local_68;
      _Var1 = p_Var10[1]._M_color;
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar3 = (pCVar15->super_TestCaseGroup).m_context;
      pcVar9 = viewClassToName(_Var1);
      tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar8,pCVar3->m_testCtx,pcVar9,pcVar9);
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_021985d0;
      pTVar8->m_context = pCVar3;
      iVar16._M_current = (uint *)pTVar8;
      tcu::TestNode::addChild(local_40,(TestNode *)pTVar8);
      if (0 < (int)((ulong)((long)p_Var10[1]._M_left - (long)p_Var10[1]._M_parent) >> 2)) {
        lVar18 = 0;
        do {
          p_Var11 = p_Var10[1]._M_parent;
          if (0 < (int)((ulong)((long)p_Var10[1]._M_left - (long)p_Var11) >> 2)) {
            lVar17 = 0;
            do {
              _Var1 = (&p_Var11->_M_color)[lVar18];
              _Var2 = (&p_Var11->_M_color)[lVar17];
              if (((_Var1 == _Var2) || (bVar5 = isFloatFormat(_Var1), !bVar5)) ||
                 (bVar5 = isFloatFormat(_Var2), !bVar5)) {
                iVar16._M_current = (uint *)(ulong)_Var1;
                addCopyTests(pTVar8,_Var1,_Var2);
              }
              lVar17 = lVar17 + 1;
              p_Var11 = p_Var10[1]._M_parent;
            } while (lVar17 < (int)((ulong)((long)p_Var10[1]._M_left - (long)p_Var11) >> 2));
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < (int)((ulong)((long)p_Var10[1]._M_left - (long)p_Var10[1]._M_parent) >> 2)
                );
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != &local_f8._M_t._M_impl.super__Rb_tree_header);
  }
  pCVar15 = local_68;
  p_Var13 = local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_98._M_t._M_impl.super__Rb_tree_header) {
    do {
      pcVar9 = viewClassToName(p_Var13[1]._M_color);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,pcVar9,(allocator<char> *)&local_60);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_148);
      plVar14 = plVar12 + 2;
      if ((long *)*plVar12 == plVar14) {
        local_118 = *plVar14;
        pvStack_110 = (void *)plVar12[3];
        local_128 = &local_118;
      }
      else {
        local_118 = *plVar14;
        local_128 = (long *)*plVar12;
      }
      lStack_120 = plVar12[1];
      *plVar12 = (long)plVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((pointer *)
          CONCAT44(local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start._4_4_,
                   local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start._0_4_) !=
          &local_148.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete((undefined1 *)
                        CONCAT44(local_148.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_148.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_),
                        (long)local_148.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      pTVar8 = (TestCaseGroup *)operator_new(0x78);
      pCVar3 = (pCVar15->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,pCVar3->m_testCtx,(char *)local_128,(char *)local_128);
      (pTVar8->super_TestCaseGroup).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_021985d0;
      pTVar8->m_context = pCVar3;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_148,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var13[1]._M_parent);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_60,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)(p_Var13 + 2));
      iVar16._M_current = (uint *)pTVar8;
      tcu::TestNode::addChild(local_48,(TestNode *)pTVar8);
      if (0 < (int)((ulong)((long)local_148.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           CONCAT44(local_148.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    local_148.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_4_)) >> 2)) {
        lVar18 = 0;
        do {
          if (0 < (int)((ulong)((long)local_60.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_60.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2)) {
            lVar17 = 0;
            do {
              format = *(deUint32 *)
                        (CONCAT44(local_148.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_148.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar18 * 4);
              format_00 = local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar17];
              if (((format == format_00) || (bVar5 = isFloatFormat(format), !bVar5)) ||
                 (bVar5 = isFloatFormat(format_00), !bVar5)) {
                addCopyTests(pTVar8,format,format_00);
                iVar16._M_current = (uint *)(ulong)format_00;
                addCopyTests(pTVar8,format_00,format);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 < (int)((ulong)((long)local_60.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_60.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 2));
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < (int)((ulong)((long)local_148.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       CONCAT44(local_148.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                local_148.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start._0_4_)) >>
                               2));
      }
      if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        iVar16._M_current =
             (uint *)((long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                     (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start);
        operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,(ulong)iVar16._M_current);
      }
      pCVar15 = local_68;
      pvVar4 = (void *)CONCAT44(local_148.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_148.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar4 != (void *)0x0) {
        iVar16._M_current =
             (uint *)((long)local_148.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
        operator_delete(pvVar4,(ulong)iVar16._M_current);
      }
      if (local_128 != &local_118) {
        iVar16._M_current = (uint *)(local_118 + 1);
        operator_delete(local_128,(ulong)iVar16._M_current);
      }
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while ((_Rb_tree_header *)p_Var13 != &local_98._M_t._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::_M_erase((_Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
              *)local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (_Link_type)iVar16._M_current);
  std::
  _Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::_M_erase((_Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)local_f8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (_Link_type)iVar16._M_current);
  std::
  _Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::_M_erase((_Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::ViewClass>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::ViewClass,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)local_c8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (_Link_type)iVar16._M_current);
  return extraout_EAX;
}

Assistant:

void CopyImageTests::init (void)
{
	TestCaseGroup* const	nonCompressedGroup	= new TestCaseGroup(m_context, "non_compressed", "Test copying between textures.");
	TestCaseGroup* const	compressedGroup		= new TestCaseGroup(m_context, "compressed", "Test copying between compressed textures.");
	TestCaseGroup* const	mixedGroup			= new TestCaseGroup(m_context, "mixed", "Test copying between compressed and non-compressed textures.");

	addChild(nonCompressedGroup);
	addChild(compressedGroup);
	addChild(mixedGroup);

	map<ViewClass, vector<deUint32> >							textureFormatViewClasses;
	map<ViewClass, vector<deUint32> >							compressedTextureFormatViewClasses;
	map<ViewClass, pair<vector<deUint32>, vector<deUint32> > >	mixedViewClasses;

	// Texture view classes
	textureFormatViewClasses[VIEWCLASS_128_BITS]		= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_96_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_64_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_48_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_32_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_24_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_16_BITS]			= vector<deUint32>();
	textureFormatViewClasses[VIEWCLASS_8_BITS]			= vector<deUint32>();

	// 128bit / VIEWCLASS_128_BITS
	textureFormatViewClasses[VIEWCLASS_128_BITS].push_back(GL_RGBA32F);
	textureFormatViewClasses[VIEWCLASS_128_BITS].push_back(GL_RGBA32I);
	textureFormatViewClasses[VIEWCLASS_128_BITS].push_back(GL_RGBA32UI);

	// 96bit / VIEWCLASS_96_BITS
	textureFormatViewClasses[VIEWCLASS_96_BITS].push_back(GL_RGB32F);
	textureFormatViewClasses[VIEWCLASS_96_BITS].push_back(GL_RGB32I);
	textureFormatViewClasses[VIEWCLASS_96_BITS].push_back(GL_RGB32UI);

	// 64bit / VIEWCLASS_64_BITS
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RG32F);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RG32I);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RG32UI);

	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RGBA16F);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RGBA16I);
	textureFormatViewClasses[VIEWCLASS_64_BITS].push_back(GL_RGBA16UI);

	// 48bit / VIEWCLASS_48_BITS
	textureFormatViewClasses[VIEWCLASS_48_BITS].push_back(GL_RGB16F);
	textureFormatViewClasses[VIEWCLASS_48_BITS].push_back(GL_RGB16I);
	textureFormatViewClasses[VIEWCLASS_48_BITS].push_back(GL_RGB16UI);

	// 32bit / VIEWCLASS_32_BITS
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R32F);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R32I);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R32UI);

	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RG16F);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RG16I);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RG16UI);

	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8I);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8UI);

	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_R11F_G11F_B10F);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGB10_A2UI);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGB10_A2);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGBA8_SNORM);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_SRGB8_ALPHA8);
	textureFormatViewClasses[VIEWCLASS_32_BITS].push_back(GL_RGB9_E5);

	// 24bit / VIEWCLASS_24_BITS
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8I);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8UI);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_RGB8_SNORM);
	textureFormatViewClasses[VIEWCLASS_24_BITS].push_back(GL_SRGB8);

	// 16bit / VIEWCLASS_16_BITS
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_R16F);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_R16I);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_R16UI);

	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8I);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8UI);
	textureFormatViewClasses[VIEWCLASS_16_BITS].push_back(GL_RG8_SNORM);

	// 8bit / VIEWCLASS_8_BITS
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8);
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8I);
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8UI);
	textureFormatViewClasses[VIEWCLASS_8_BITS].push_back(GL_R8_SNORM);

	// Compressed texture view classes
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_R11]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_RG11]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGB]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGBA]			= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_EAC_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_4x4_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x4_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x5_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x5_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x6_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x5_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x6_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x8_RGBA]		= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x5_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x6_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x8_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x10_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x10_RGBA]	= vector<deUint32>();
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x12_RGBA]	= vector<deUint32>();

	// VIEWCLASS_EAC_R11
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_R11].push_back(GL_COMPRESSED_R11_EAC);
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_R11].push_back(GL_COMPRESSED_SIGNED_R11_EAC);

	// VIEWCLASS_EAC_RG11
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_RG11].push_back(GL_COMPRESSED_RG11_EAC);
	compressedTextureFormatViewClasses[VIEWCLASS_EAC_RG11].push_back(GL_COMPRESSED_SIGNED_RG11_EAC);

	// VIEWCLASS_ETC2_RGB
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGB].push_back(GL_COMPRESSED_RGB8_ETC2);
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGB].push_back(GL_COMPRESSED_SRGB8_ETC2);

	// VIEWCLASS_ETC2_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGBA].push_back(GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2);
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_RGBA].push_back(GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2);

	// VIEWCLASS_ETC2_EAC_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_EAC_RGBA].push_back(GL_COMPRESSED_RGBA8_ETC2_EAC);
	compressedTextureFormatViewClasses[VIEWCLASS_ETC2_EAC_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC);

	// VIEWCLASS_ASTC_4x4_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_4x4_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_4x4);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_4x4_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4);

	// VIEWCLASS_ASTC_5x4_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x4_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_5x4);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x4_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4);

	// VIEWCLASS_ASTC_5x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_5x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_5x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5);

	// VIEWCLASS_ASTC_6x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_6x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5);

	// VIEWCLASS_ASTC_6x6_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x6_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_6x6);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_6x6_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6);

	// VIEWCLASS_ASTC_8x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_8x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5);

	// VIEWCLASS_ASTC_8x6_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x6_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_8x6);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x6_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6);

	// VIEWCLASS_ASTC_8x8_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x8_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_8x8);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_8x8_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8);

	// VIEWCLASS_ASTC_10x5_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x5_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x5);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x5_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5);

	// VIEWCLASS_ASTC_10x6_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x6_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x6);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x6_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6);

	// VIEWCLASS_ASTC_10x8_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x8_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x8);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x8_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8);

	// VIEWCLASS_ASTC_10x10_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x10_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_10x10);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_10x10_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10);

	// VIEWCLASS_ASTC_12x10_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x10_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_12x10);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x10_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10);

	// VIEWCLASS_ASTC_12x12_RGBA
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x12_RGBA].push_back(GL_COMPRESSED_RGBA_ASTC_12x12);
	compressedTextureFormatViewClasses[VIEWCLASS_ASTC_12x12_RGBA].push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12);

	// Mixed view classes
	mixedViewClasses[VIEWCLASS_128_BITS] = pair<vector<deUint32>, vector<deUint32> >();
	mixedViewClasses[VIEWCLASS_64_BITS] = pair<vector<deUint32>, vector<deUint32> >();

	// 128 bits

	// Non compressed
	mixedViewClasses[VIEWCLASS_128_BITS].first.push_back(GL_RGBA32F);
	mixedViewClasses[VIEWCLASS_128_BITS].first.push_back(GL_RGBA32UI);
	mixedViewClasses[VIEWCLASS_128_BITS].first.push_back(GL_RGBA32I);

	// Compressed
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA8_ETC2_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RG11_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SIGNED_RG11_EAC);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_4x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_5x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_5x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_6x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_6x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_8x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_8x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_8x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_10x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_12x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_RGBA_ASTC_12x12);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10);
	mixedViewClasses[VIEWCLASS_128_BITS].second.push_back(GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12);

	// 64 bits

	// Non compressed
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RGBA16F);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RGBA16UI);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RGBA16I);

	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RG32F);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RG32UI);
	mixedViewClasses[VIEWCLASS_64_BITS].first.push_back(GL_RG32I);

	// Compressed
	mixedViewClasses[VIEWCLASS_64_BITS].second.push_back(GL_COMPRESSED_R11_EAC);
	mixedViewClasses[VIEWCLASS_64_BITS].second.push_back(GL_COMPRESSED_SIGNED_R11_EAC);

	for (map<ViewClass, vector<deUint32> >::const_iterator viewClassIter = textureFormatViewClasses.begin(); viewClassIter != textureFormatViewClasses.end(); ++viewClassIter)
	{
		const vector<deUint32>&	formats		= viewClassIter->second;
		const ViewClass			viewClass	= viewClassIter->first;
		TestCaseGroup* const	viewGroup	= new TestCaseGroup(m_context, viewClassToName(viewClass), viewClassToName(viewClass));

		nonCompressedGroup->addChild(viewGroup);

		for (int srcFormatNdx = 0; srcFormatNdx < (int)formats.size(); srcFormatNdx++)
		for (int dstFormatNdx = 0; dstFormatNdx < (int)formats.size(); dstFormatNdx++)
		{
			const deUint32 srcFormat = formats[srcFormatNdx];
			const deUint32 dstFormat = formats[dstFormatNdx];

			if (srcFormat != dstFormat && isFloatFormat(srcFormat) && isFloatFormat(dstFormat))
				continue;

			addCopyTests(viewGroup, srcFormat, dstFormat);
		}
	}

	for (map<ViewClass, vector<deUint32> >::const_iterator viewClassIter = compressedTextureFormatViewClasses.begin(); viewClassIter != compressedTextureFormatViewClasses.end(); ++viewClassIter)
	{
		const vector<deUint32>&	formats		= viewClassIter->second;
		const ViewClass			viewClass	= viewClassIter->first;
		TestCaseGroup* const	viewGroup	= new TestCaseGroup(m_context, viewClassToName(viewClass), viewClassToName(viewClass));

		compressedGroup->addChild(viewGroup);

		for (int srcFormatNdx = 0; srcFormatNdx < (int)formats.size(); srcFormatNdx++)
		for (int dstFormatNdx = 0; dstFormatNdx < (int)formats.size(); dstFormatNdx++)
		{
			const deUint32 srcFormat = formats[srcFormatNdx];
			const deUint32 dstFormat = formats[dstFormatNdx];

			if (srcFormat != dstFormat && isFloatFormat(srcFormat) && isFloatFormat(dstFormat))
				continue;

			addCopyTests(viewGroup, srcFormat, dstFormat);
		}
	}

	for (map<ViewClass, pair<vector<deUint32>, vector<deUint32> > >::const_iterator iter = mixedViewClasses.begin(); iter != mixedViewClasses.end(); ++iter)
	{
		const ViewClass			viewClass				= iter->first;
		const string			viewClassName			= string(viewClassToName(viewClass)) + "_mixed";
		TestCaseGroup* const	viewGroup				= new TestCaseGroup(m_context, viewClassName.c_str(), viewClassName.c_str());

		const vector<deUint32>	nonCompressedFormats	= iter->second.first;
		const vector<deUint32>	compressedFormats		= iter->second.second;

		mixedGroup->addChild(viewGroup);

		for (int srcFormatNdx = 0; srcFormatNdx < (int)nonCompressedFormats.size(); srcFormatNdx++)
		for (int dstFormatNdx = 0; dstFormatNdx < (int)compressedFormats.size(); dstFormatNdx++)
		{
			const deUint32 srcFormat = nonCompressedFormats[srcFormatNdx];
			const deUint32 dstFormat = compressedFormats[dstFormatNdx];

			if (srcFormat != dstFormat && isFloatFormat(srcFormat) && isFloatFormat(dstFormat))
				continue;

			addCopyTests(viewGroup, srcFormat, dstFormat);
			addCopyTests(viewGroup, dstFormat, srcFormat);
		}
	}
}